

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * fts5CloneColset(int *pRc,Fts5Colset *pOrig)

{
  size_t __n;
  sqlite3_int64 nByte;
  Fts5Colset *pRet;
  Fts5Colset *pOrig_local;
  int *pRc_local;
  
  if (pOrig == (Fts5Colset *)0x0) {
    nByte = 0;
  }
  else {
    __n = (long)(pOrig->nCol + -1) * 4 + 8;
    nByte = (sqlite3_int64)sqlite3Fts5MallocZero(pRc,__n);
    if ((void *)nByte != (void *)0x0) {
      memcpy((void *)nByte,pOrig,__n);
    }
  }
  return (Fts5Colset *)nByte;
}

Assistant:

static Fts5Colset *fts5CloneColset(int *pRc, Fts5Colset *pOrig){
  Fts5Colset *pRet;
  if( pOrig ){
    sqlite3_int64 nByte = sizeof(Fts5Colset) + (pOrig->nCol-1) * sizeof(int);
    pRet = (Fts5Colset*)sqlite3Fts5MallocZero(pRc, nByte);
    if( pRet ){ 
      memcpy(pRet, pOrig, (size_t)nByte);
    }
  }else{
    pRet = 0;
  }
  return pRet;
}